

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O0

Elem MakeMonic<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *a,
               Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
               *field)

{
  long lVar1;
  reference pvVar2;
  size_type sVar3;
  Multiplier *in_RSI;
  long in_FS_OFFSET;
  size_t i;
  Elem inv;
  Multiplier mul;
  undefined4 in_stack_fffffffffffffdb8;
  Elem in_stack_fffffffffffffdbc;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_stack_fffffffffffffdc0;
  ulong __n;
  ulong local_230;
  Elem local_20c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  if (*pvVar2 == 1) {
    local_20c = 0;
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    local_20c = anon_unknown.dwarf_250df77::
                Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                ::Inv((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                       *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),0);
    anon_unknown.dwarf_250df77::
    Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
    ::Multiplier::Multiplier(in_RSI,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    *pvVar2 = 1;
    local_230 = 0;
    while (__n = local_230,
          sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)),
          __n < sVar3 - 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RSI,__n);
      in_stack_fffffffffffffdbc =
           anon_unknown.dwarf_250df77::
           Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
           ::Multiplier::operator()
                     ((Multiplier *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),0)
      ;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RSI,__n);
      *pvVar2 = in_stack_fffffffffffffdbc;
      local_230 = local_230 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_20c;
}

Assistant:

typename F::Elem MakeMonic(std::vector<typename F::Elem>& a, const F& field) {
    CHECK_SAFE(a.back() != 0);
    if (a.back() == 1) return 0;
    auto inv = field.Inv(a.back());
    typename F::Multiplier mul(field, inv);
    a.back() = 1;
    for (size_t i = 0; i < a.size() - 1; ++i) {
        a[i] = mul(a[i]);
    }
    return inv;
}